

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SegReaderFirstDocid(Fts3Table *pTab,Fts3SegReader *pReader)

{
  int iVar1;
  long in_FS_OFFSET;
  u8 local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((char)pTab == '\0') || (pReader->ppNextElem == (Fts3HashElem **)0x0)) {
    iVar1 = fts3SegReaderRequire(pReader,pReader->aDoclist,10);
    if (iVar1 == 0) {
      iVar1 = sqlite3Fts3GetVarintU(pReader->aDoclist,(sqlite_uint64 *)&pReader->iDocid);
      pReader->pOffsetList = pReader->aDoclist + iVar1;
      iVar1 = 0;
    }
  }
  else {
    pReader->iDocid = 0;
    pReader->nOffsetList = 0;
    iVar1 = 0;
    sqlite3Fts3DoclistPrev
              (0,pReader->aDoclist,pReader->nDoclist,&pReader->pOffsetList,&pReader->iDocid,
               &pReader->nOffsetList,&local_19);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3SegReaderFirstDocid(Fts3Table *pTab, Fts3SegReader *pReader){
  int rc = SQLITE_OK;
  assert( pReader->aDoclist );
  assert( !pReader->pOffsetList );
  if( pTab->bDescIdx && fts3SegReaderIsPending(pReader) ){
    u8 bEof = 0;
    pReader->iDocid = 0;
    pReader->nOffsetList = 0;
    sqlite3Fts3DoclistPrev(0,
        pReader->aDoclist, pReader->nDoclist, &pReader->pOffsetList,
        &pReader->iDocid, &pReader->nOffsetList, &bEof
    );
  }else{
    rc = fts3SegReaderRequire(pReader, pReader->aDoclist, FTS3_VARINT_MAX);
    if( rc==SQLITE_OK ){
      int n = sqlite3Fts3GetVarint(pReader->aDoclist, &pReader->iDocid);
      pReader->pOffsetList = &pReader->aDoclist[n];
    }
  }
  return rc;
}